

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

int __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::remove
          (Move_iterator *this,char *__filename)

{
  reference pvVar1;
  mutex_type *in_RDX;
  lock_guard<std::mutex> local_28;
  Guard_t g;
  Size_t at_local;
  Move_iterator *this_local;
  
  g._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,*(mutex_type **)__filename);
  pvVar1 = std::
           vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           ::operator[](*(vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                          **)(__filename + 0x38),(size_type)g._M_device);
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::unique_ptr
            ((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)this,pvVar1);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return (int)this;
}

Assistant:

auto remove(Size_t at) -> std::unique_ptr<Event>
            {
                Guard_t g{mtx_};
                return std::move(events_[at]);
            }